

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O3

double uprv_fmin_63(double x,double y)

{
  double dVar1;
  
  dVar1 = NAN;
  if (((((ulong)ABS(x) < 0x7ff0000000000001) && ((ulong)ABS(y) < 0x7ff0000000000001)) &&
      (dVar1 = y, (x != 0.0 || y != 0.0) || -1 < (long)y)) && (x <= y)) {
    dVar1 = x;
  }
  return dVar1;
}

Assistant:

U_CAPI double U_EXPORT2
uprv_fmin(double x, double y)
{
#if IEEE_754
    /* first handle NaN*/
    if(uprv_isNaN(x) || uprv_isNaN(y))
        return uprv_getNaN();

    /* check for -0 and 0*/
    if(x == 0.0 && y == 0.0 && u_signBit(y))
        return y;

#endif

    /* this should work for all flt point w/o NaN and Inf special cases */
    return (x > y ? y : x);
}